

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O3

void __thiscall spatial_region::pmerging(spatial_region *this,double *ppd,string *pmerging)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  cellp ***pppcVar8;
  cellp *pcVar9;
  particle *ppVar10;
  particle *ppVar11;
  particle *ppVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  byte bVar22;
  int iVar23;
  uint uVar24;
  double *__s;
  double *__s_00;
  double *pdVar25;
  particle **pppVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  double *pdVar30;
  ulong uVar31;
  particle *ppVar32;
  double *pdVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double local_78;
  long local_68;
  double local_58;
  long local_48;
  
  uVar24 = this->n_ion_populations;
  uVar37 = uVar24 + 3;
  uVar27 = 0xffffffffffffffff;
  if (-4 < (int)uVar24) {
    uVar27 = (long)(int)uVar37 << 3;
  }
  __s = (double *)operator_new__(uVar27);
  __s_00 = (double *)operator_new__(uVar27);
  if (-3 < (int)uVar24) {
    uVar27 = 1;
    if (1 < (int)uVar37) {
      uVar27 = (ulong)uVar37;
    }
    memset(__s,0,uVar27 << 3);
    memset(__s_00,0,uVar27 << 3);
  }
  iVar23 = this->nx;
  if (0 < (long)iVar23) {
    uVar37 = this->ny;
    uVar6 = this->nz;
    pppcVar8 = (this->cp).p._M_t.super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>.
               _M_t.super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
               super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
    pdVar25 = this->icmr;
    lVar35 = 0;
    do {
      if (0 < (int)uVar37) {
        uVar27 = 0;
        do {
          if (0 < (int)uVar6) {
            uVar36 = 0;
            pcVar9 = pppcVar8[lVar35][uVar27];
            do {
              for (lVar38 = (long)pcVar9[uVar36].pl.head; lVar38 != 0;
                  lVar38 = *(long *)(lVar38 + 0x58)) {
                dVar49 = *(double *)(lVar38 + 0x40);
                if ((dVar49 != -1.0) || (NAN(dVar49))) {
                  if ((dVar49 != 1.0) || (NAN(dVar49))) {
                    if ((dVar49 != 0.0) || (NAN(dVar49))) {
                      if (0 < (int)uVar24) {
                        uVar28 = 0;
                        do {
                          if ((dVar49 == pdVar25[uVar28]) && (!NAN(dVar49) && !NAN(pdVar25[uVar28]))
                             ) {
                            __s_00[uVar28 + 3] = *(double *)(lVar38 + 0x38) + __s_00[uVar28 + 3];
                          }
                          uVar28 = uVar28 + 1;
                        } while (uVar24 != uVar28);
                      }
                    }
                    else {
                      __s_00[2] = *(double *)(lVar38 + 0x38) + __s_00[2];
                    }
                  }
                  else {
                    __s_00[1] = *(double *)(lVar38 + 0x38) + __s_00[1];
                  }
                }
                else {
                  *__s_00 = *__s_00 - *(double *)(lVar38 + 0x38);
                }
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 != uVar6);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar37);
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 != iVar23);
  }
  iVar23 = std::__cxx11::string::compare((char *)pmerging);
  if (iVar23 == 0) {
    uVar24 = this->nx;
    if (0 < (int)uVar24) {
      local_58 = 0.0;
      iVar23 = this->ny;
      auVar40 = ZEXT864(0) << 0x40;
      do {
        if (0 < iVar23) {
          iVar34 = this->nz;
          lVar35 = 0;
          do {
            if (0 < iVar34) {
              lVar38 = 0;
              do {
                ppVar32 = (this->cp).p._M_t.
                          super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                          super__Head_base<0UL,_cellp_***,_false>._M_head_impl[(long)local_58]
                          [lVar35][lVar38].pl.head;
                if (ppVar32 != (particle *)0x0) {
                  do {
                    iVar23 = this->n_random;
                    pdVar25 = this->random;
                    iVar34 = iVar23 + 1;
                    if (0x36 < iVar23) {
                      iVar34 = 0;
                    }
                    dVar49 = pdVar25[iVar23 % 0x37] -
                             pdVar25[iVar23 + 0x1f + ((iVar23 + 0x1f) / 0x37) * -0x37];
                    auVar55._8_8_ = 0;
                    auVar55._0_8_ = dVar49;
                    uVar21 = vcmpsd_avx512f(auVar55,auVar40._0_16_,1);
                    bVar14 = (bool)((byte)uVar21 & 1);
                    dVar49 = (double)((ulong)bVar14 * (long)(dVar49 + 1.0) +
                                     (ulong)!bVar14 * (long)dVar49);
                    pdVar25[iVar23 % 0x37] = dVar49;
                    this->n_random = iVar34;
                    ppVar10 = ppVar32->next;
                    if (dVar49 < *ppd) {
                      dVar49 = ppVar32->cmr;
                      if ((dVar49 != -1.0) || (NAN(dVar49))) {
                        if ((dVar49 != 1.0) || (NAN(dVar49))) {
                          if ((dVar49 != 0.0) || (NAN(dVar49))) {
                            iVar23 = this->n_ion_populations;
                            if (0 < (long)iVar23) {
                              pdVar25 = this->icmr;
                              lVar39 = 0;
                              do {
                                if ((ppVar32->cmr == pdVar25[lVar39]) &&
                                   (!NAN(ppVar32->cmr) && !NAN(pdVar25[lVar39]))) {
                                  __s[lVar39 + 3] = ppVar32->q + __s[lVar39 + 3];
                                }
                                lVar39 = lVar39 + 1;
                              } while (iVar23 != lVar39);
                            }
                          }
                          else {
                            __s[2] = ppVar32->q + __s[2];
                          }
                        }
                        else {
                          __s[1] = ppVar32->q + __s[1];
                        }
                      }
                      else {
                        *__s = *__s - ppVar32->q;
                      }
                      ppVar11 = ppVar32->previous;
                      if (ppVar10 != (particle *)0x0) {
                        ppVar10->previous = ppVar11;
                      }
                      if (ppVar11 == (particle *)0x0) {
                        (this->cp).p._M_t.
                        super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                        super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                        super__Head_base<0UL,_cellp_***,_false>._M_head_impl[(long)local_58][lVar35]
                        [lVar38].pl.head = ppVar10;
                        pcVar9 = (this->cp).p._M_t.
                                 super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                 .super__Head_base<0UL,_cellp_***,_false>._M_head_impl
                                 [(long)local_58][lVar35];
                        pcVar9[lVar38].pl.start = pcVar9[lVar38].pl.head;
                      }
                      else {
                        ppVar11->next = ppVar10;
                      }
                      delete_particle(this,ppVar32,false);
                      auVar40 = ZEXT864(0) << 0x40;
                    }
                    ppVar32 = ppVar10;
                  } while (ppVar10 != (particle *)0x0);
                  iVar34 = this->nz;
                }
                lVar38 = lVar38 + 1;
              } while (lVar38 < iVar34);
              iVar23 = this->ny;
            }
            lVar35 = lVar35 + 1;
          } while (lVar35 < iVar23);
          uVar24 = this->nx;
        }
        local_58 = (double)((long)local_58 + 1);
      } while ((long)local_58 < (long)(int)uVar24);
    }
    dVar49 = *__s_00 - *__s;
    if ((dVar49 != 0.0) || (NAN(dVar49))) {
      *__s_00 = *__s_00 / dVar49;
    }
    dVar49 = __s_00[1] - __s[1];
    if ((dVar49 != 0.0) || (NAN(dVar49))) {
      __s_00[1] = __s_00[1] / dVar49;
    }
    dVar49 = __s_00[2] - __s[2];
    if ((dVar49 != 0.0) || (NAN(dVar49))) {
      __s_00[2] = __s_00[2] / dVar49;
    }
    uVar37 = this->n_ion_populations;
    if (0 < (int)uVar37) {
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar27 = 0;
      auVar41 = vpbroadcastq_avx512f();
      do {
        auVar42 = vpbroadcastq_avx512f();
        auVar42 = vporq_avx512f(auVar42,auVar40);
        uVar28 = vpcmpuq_avx512f(auVar42,auVar41,2);
        pdVar25 = __s_00 + uVar27 + 3;
        auVar42._8_8_ = (ulong)((byte)(uVar28 >> 1) & 1) * (long)pdVar25[1];
        auVar42._0_8_ = (ulong)((byte)uVar28 & 1) * (long)*pdVar25;
        auVar42._16_8_ = (ulong)((byte)(uVar28 >> 2) & 1) * (long)pdVar25[2];
        auVar42._24_8_ = (ulong)((byte)(uVar28 >> 3) & 1) * (long)pdVar25[3];
        auVar42._32_8_ = (ulong)((byte)(uVar28 >> 4) & 1) * (long)pdVar25[4];
        auVar42._40_8_ = (ulong)((byte)(uVar28 >> 5) & 1) * (long)pdVar25[5];
        auVar42._48_8_ = (ulong)((byte)(uVar28 >> 6) & 1) * (long)pdVar25[6];
        auVar42._56_8_ = (uVar28 >> 7) * (long)pdVar25[7];
        pdVar25 = __s + uVar27 + 3;
        auVar45._8_8_ = (ulong)((byte)(uVar28 >> 1) & 1) * (long)pdVar25[1];
        auVar45._0_8_ = (ulong)((byte)uVar28 & 1) * (long)*pdVar25;
        auVar45._16_8_ = (ulong)((byte)(uVar28 >> 2) & 1) * (long)pdVar25[2];
        auVar45._24_8_ = (ulong)((byte)(uVar28 >> 3) & 1) * (long)pdVar25[3];
        auVar45._32_8_ = (ulong)((byte)(uVar28 >> 4) & 1) * (long)pdVar25[4];
        auVar45._40_8_ = (ulong)((byte)(uVar28 >> 5) & 1) * (long)pdVar25[5];
        auVar45._48_8_ = (ulong)((byte)(uVar28 >> 6) & 1) * (long)pdVar25[6];
        auVar45._56_8_ = (uVar28 >> 7) * (long)pdVar25[7];
        auVar45 = vsubpd_avx512f(auVar42,auVar45);
        auVar42 = vdivpd_avx512f(auVar42,auVar45);
        uVar36 = vcmppd_avx512f(auVar45,ZEXT1664(ZEXT816(0)),4);
        uVar28 = uVar28 & uVar36;
        pdVar25 = __s_00 + uVar27 + 3;
        bVar14 = (bool)((byte)uVar28 & 1);
        bVar15 = (bool)((byte)(uVar28 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar28 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar28 >> 3) & 1);
        bVar18 = (bool)((byte)(uVar28 >> 4) & 1);
        bVar19 = (bool)((byte)(uVar28 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar28 >> 6) & 1);
        *pdVar25 = (double)((ulong)bVar14 * auVar42._0_8_ | (ulong)!bVar14 * (long)*pdVar25);
        pdVar25[1] = (double)((ulong)bVar15 * auVar42._8_8_ | (ulong)!bVar15 * (long)pdVar25[1]);
        pdVar25[2] = (double)((ulong)bVar16 * auVar42._16_8_ | (ulong)!bVar16 * (long)pdVar25[2]);
        pdVar25[3] = (double)((ulong)bVar17 * auVar42._24_8_ | (ulong)!bVar17 * (long)pdVar25[3]);
        pdVar25[4] = (double)((ulong)bVar18 * auVar42._32_8_ | (ulong)!bVar18 * (long)pdVar25[4]);
        pdVar25[5] = (double)((ulong)bVar19 * auVar42._40_8_ | (ulong)!bVar19 * (long)pdVar25[5]);
        pdVar25[6] = (double)((ulong)bVar20 * auVar42._48_8_ | (ulong)!bVar20 * (long)pdVar25[6]);
        pdVar25[7] = (double)((uVar28 >> 7) * auVar42._56_8_ |
                             (ulong)!SUB81(uVar28 >> 7,0) * (long)pdVar25[7]);
        uVar27 = uVar27 + 8;
      } while ((uVar37 + 7 & 0xfffffff8) != uVar27);
    }
    if (0 < (int)uVar24) {
      uVar6 = this->ny;
      uVar7 = this->nz;
      uVar27 = 0;
      do {
        if (0 < (int)uVar6) {
          pppcVar8 = (this->cp).p._M_t.
                     super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                     super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
          uVar36 = 0;
          do {
            if (0 < (int)uVar7) {
              uVar28 = 0;
              pcVar9 = pppcVar8[uVar27][uVar36];
              do {
                lVar35 = (long)pcVar9[uVar28].pl.head;
                if (lVar35 != 0) {
                  pdVar25 = this->icmr;
                  do {
                    dVar49 = *(double *)(lVar35 + 0x40);
                    if ((((dVar49 == -1.0) && (pdVar33 = __s_00, !NAN(dVar49))) ||
                        ((dVar49 == 1.0 && (pdVar33 = __s_00 + 1, !NAN(dVar49))))) ||
                       ((dVar49 == 0.0 && (pdVar33 = __s_00 + 2, !NAN(dVar49))))) {
                      *(double *)(lVar35 + 0x38) = *pdVar33 * *(double *)(lVar35 + 0x38);
                    }
                    else if (0 < (int)uVar37) {
                      uVar29 = 0;
                      do {
                        if ((dVar49 == pdVar25[uVar29]) && (!NAN(dVar49) && !NAN(pdVar25[uVar29])))
                        {
                          *(double *)(lVar35 + 0x38) =
                               __s_00[uVar29 + 3] * *(double *)(lVar35 + 0x38);
                        }
                        uVar29 = uVar29 + 1;
                      } while (uVar37 != uVar29);
                    }
                    lVar35 = *(long *)(lVar35 + 0x58);
                  } while (lVar35 != 0);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar7);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar6);
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar24);
    }
  }
  else {
    iVar23 = std::__cxx11::string::compare((char *)pmerging);
    if (iVar23 == 0) {
      uVar24 = this->n_ion_populations;
      uVar37 = uVar24 + 3;
      uVar27 = 0xffffffffffffffff;
      if (-4 < (int)uVar24) {
        uVar27 = (long)(int)uVar37 << 3;
      }
      pdVar25 = (double *)operator_new__(uVar27);
      if (-3 < (int)uVar24) {
        uVar27 = 1;
        if (1 < (int)uVar37) {
          uVar27 = (ulong)uVar37;
        }
        memset(pdVar25,0,uVar27 << 3);
      }
      iVar23 = this->nx;
      uVar27 = (ulong)iVar23;
      if (0 < (long)uVar27) {
        pppcVar8 = (this->cp).p._M_t.
                   super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                   super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
        uVar6 = this->ny;
        uVar7 = this->nz;
        pdVar33 = this->icmr;
        uVar36 = 0;
        do {
          if (0 < (int)uVar6) {
            uVar28 = 0;
            do {
              if (0 < (int)uVar7) {
                uVar29 = 0;
                pcVar9 = pppcVar8[uVar36][uVar28];
                do {
                  for (lVar35 = (long)pcVar9[uVar29].pl.head; lVar35 != 0;
                      lVar35 = *(long *)(lVar35 + 0x58)) {
                    dVar49 = *(double *)(lVar35 + 0x40);
                    if ((((dVar49 == -1.0) && (pdVar30 = pdVar25, !NAN(dVar49))) ||
                        ((dVar49 == 1.0 && (pdVar30 = pdVar25 + 1, !NAN(dVar49))))) ||
                       ((dVar49 == 0.0 && (pdVar30 = pdVar25 + 2, !NAN(dVar49))))) {
                      *pdVar30 = *pdVar30 + 1.0;
                    }
                    else if (0 < (int)uVar24) {
                      uVar31 = 0;
                      do {
                        if ((dVar49 == pdVar33[uVar31]) && (!NAN(dVar49) && !NAN(pdVar33[uVar31])))
                        {
                          pdVar25[uVar31 + 3] = pdVar25[uVar31 + 3] + 1.0;
                        }
                        uVar31 = uVar31 + 1;
                      } while (uVar24 != uVar31);
                    }
                  }
                  uVar29 = uVar29 + 1;
                } while (uVar29 != uVar7);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != uVar6);
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != uVar27);
      }
      if (-3 < (int)uVar24) {
        auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar24 = 1;
        if (1 < (int)uVar37) {
          uVar24 = uVar37;
        }
        auVar41 = vpbroadcastq_avx512f();
        uVar36 = 0;
        do {
          auVar42 = vpbroadcastq_avx512f();
          auVar42 = vporq_avx512f(auVar42,auVar40);
          uVar28 = vpcmpuq_avx512f(auVar42,auVar41,2);
          pdVar33 = __s_00 + uVar36;
          bVar13 = (byte)uVar28;
          auVar43._8_8_ = (ulong)((byte)(uVar28 >> 1) & 1) * (long)pdVar33[1];
          auVar43._0_8_ = (ulong)(bVar13 & 1) * (long)*pdVar33;
          auVar43._16_8_ = (ulong)((byte)(uVar28 >> 2) & 1) * (long)pdVar33[2];
          auVar43._24_8_ = (ulong)((byte)(uVar28 >> 3) & 1) * (long)pdVar33[3];
          auVar43._32_8_ = (ulong)((byte)(uVar28 >> 4) & 1) * (long)pdVar33[4];
          auVar43._40_8_ = (ulong)((byte)(uVar28 >> 5) & 1) * (long)pdVar33[5];
          auVar43._48_8_ = (ulong)((byte)(uVar28 >> 6) & 1) * (long)pdVar33[6];
          auVar43._56_8_ = (uVar28 >> 7) * (long)pdVar33[7];
          pdVar33 = pdVar25 + uVar36;
          auVar44._8_8_ = (ulong)((byte)(uVar28 >> 1) & 1) * (long)pdVar33[1];
          auVar44._0_8_ = (ulong)(bVar13 & 1) * (long)*pdVar33;
          auVar44._16_8_ = (ulong)((byte)(uVar28 >> 2) & 1) * (long)pdVar33[2];
          auVar44._24_8_ = (ulong)((byte)(uVar28 >> 3) & 1) * (long)pdVar33[3];
          auVar44._32_8_ = (ulong)((byte)(uVar28 >> 4) & 1) * (long)pdVar33[4];
          auVar44._40_8_ = (ulong)((byte)(uVar28 >> 5) & 1) * (long)pdVar33[5];
          auVar44._48_8_ = (ulong)((byte)(uVar28 >> 6) & 1) * (long)pdVar33[6];
          auVar44._56_8_ = (uVar28 >> 7) * (long)pdVar33[7];
          auVar45 = vdivpd_avx512f(auVar43,auVar44);
          auVar42 = *(undefined1 (*) [64])(pdVar25 + uVar36);
          auVar46._0_8_ =
               (ulong)(bVar13 & 1) * auVar45._0_8_ | (ulong)!(bool)(bVar13 & 1) * auVar42._0_8_;
          bVar14 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar46._8_8_ = (ulong)bVar14 * auVar45._8_8_ | (ulong)!bVar14 * auVar42._8_8_;
          bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar46._16_8_ = (ulong)bVar14 * auVar45._16_8_ | (ulong)!bVar14 * auVar42._16_8_;
          bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
          auVar46._24_8_ = (ulong)bVar14 * auVar45._24_8_ | (ulong)!bVar14 * auVar42._24_8_;
          bVar14 = (bool)((byte)(uVar28 >> 4) & 1);
          auVar46._32_8_ = (ulong)bVar14 * auVar45._32_8_ | (ulong)!bVar14 * auVar42._32_8_;
          bVar14 = (bool)((byte)(uVar28 >> 5) & 1);
          auVar46._40_8_ = (ulong)bVar14 * auVar45._40_8_ | (ulong)!bVar14 * auVar42._40_8_;
          bVar14 = (bool)((byte)(uVar28 >> 6) & 1);
          auVar46._48_8_ = (ulong)bVar14 * auVar45._48_8_ | (ulong)!bVar14 * auVar42._48_8_;
          auVar46._56_8_ =
               (uVar28 >> 7) * auVar45._56_8_ | (ulong)!SUB81(uVar28 >> 7,0) * auVar42._56_8_;
          *(undefined1 (*) [64])(pdVar25 + uVar36) = auVar46;
          uVar36 = uVar36 + 8;
        } while ((uVar24 + 7 & 0xfffffff8) != uVar36);
      }
      if (0 < iVar23) {
        iVar23 = this->ny;
        local_48 = 0;
        do {
          if (0 < iVar23) {
            iVar34 = this->nz;
            local_68 = 0;
            do {
              if (0 < iVar34) {
                lVar35 = 0;
                do {
                  ppVar32 = (this->cp).p._M_t.
                            super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                            super__Head_base<0UL,_cellp_***,_false>._M_head_impl[local_48][local_68]
                            [lVar35].pl.head;
                  if (ppVar32 != (particle *)0x0) {
                    do {
                      dVar49 = ppVar32->cmr;
                      ppVar10 = ppVar32->next;
                      if ((dVar49 != -1.0) || (NAN(dVar49))) {
                        if ((dVar49 == 1.0) && (!NAN(dVar49))) {
                          iVar23 = this->n_random;
                          pdVar33 = this->random;
                          iVar34 = iVar23 + 1;
                          dVar49 = pdVar33[iVar23 % 0x37] -
                                   pdVar33[iVar23 + 0x1f + ((iVar23 + 0x1f) / 0x37) * -0x37];
                          auVar58._8_8_ = 0;
                          auVar58._0_8_ = dVar49;
                          uVar21 = vcmpsd_avx512f(auVar58,ZEXT816(0),1);
                          bVar14 = (bool)((byte)uVar21 & 1);
                          local_58 = (double)((ulong)bVar14 * (long)(dVar49 + 1.0) +
                                             (ulong)!bVar14 * (long)dVar49);
                          pdVar33[iVar23 % 0x37] = local_58;
                          if (0x36 < iVar23) {
                            iVar34 = 0;
                          }
                          this->n_random = iVar34;
                          local_78 = ppd[1];
                          dVar49 = (ppVar32->q + ppVar32->q) / pdVar25[1];
                          goto LAB_001357ef;
                        }
                        if ((dVar49 == 0.0) && (!NAN(dVar49))) {
                          iVar23 = this->n_random;
                          pdVar33 = this->random;
                          iVar34 = iVar23 + 1;
                          dVar49 = pdVar33[iVar23 % 0x37] -
                                   pdVar33[iVar23 + 0x1f + ((iVar23 + 0x1f) / 0x37) * -0x37];
                          auVar59._8_8_ = 0;
                          auVar59._0_8_ = dVar49;
                          uVar21 = vcmpsd_avx512f(auVar59,ZEXT816(0),1);
                          bVar14 = (bool)((byte)uVar21 & 1);
                          local_58 = (double)((ulong)bVar14 * (long)(dVar49 + 1.0) +
                                             (ulong)!bVar14 * (long)dVar49);
                          pdVar33[iVar23 % 0x37] = local_58;
                          if (0x36 < iVar23) {
                            iVar34 = 0;
                          }
                          this->n_random = iVar34;
                          local_78 = ppd[2];
                          dVar49 = (ppVar32->q + ppVar32->q) / pdVar25[2];
                          goto LAB_001357ef;
                        }
                        if (0 < this->n_ion_populations) {
                          lVar38 = 0;
                          do {
                            if ((ppVar32->cmr == this->icmr[lVar38]) &&
                               (!NAN(ppVar32->cmr) && !NAN(this->icmr[lVar38]))) {
                              iVar23 = this->n_random;
                              pdVar33 = this->random;
                              iVar34 = iVar23 + 1;
                              dVar49 = pdVar33[iVar23 % 0x37] -
                                       pdVar33[iVar23 + 0x1f + ((iVar23 + 0x1f) / 0x37) * -0x37];
                              auVar57._8_8_ = 0;
                              auVar57._0_8_ = dVar49;
                              uVar21 = vcmpsd_avx512f(auVar57,ZEXT816(0),1);
                              bVar14 = (bool)((byte)uVar21 & 1);
                              dVar49 = (double)((ulong)bVar14 * (long)(dVar49 + 1.0) +
                                               (ulong)!bVar14 * (long)dVar49);
                              pdVar33[iVar23 % 0x37] = dVar49;
                              if (0x36 < iVar23) {
                                iVar34 = 0;
                              }
                              this->n_random = iVar34;
                              dVar1 = ppd[lVar38 + 3];
                              dVar50 = pow((ppVar32->q + ppVar32->q) / pdVar25[lVar38 + 3],4.0);
                              if (dVar49 < (1.0 / (dVar50 + 1.0)) * dVar1) {
                                ppVar11 = ppVar32->next;
                                ppVar12 = ppVar32->previous;
                                if (ppVar11 != (particle *)0x0) {
                                  ppVar11->previous = ppVar12;
                                }
                                if (ppVar12 == (particle *)0x0) {
                                  (this->cp).p._M_t.
                                  super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                  .super__Head_base<0UL,_cellp_***,_false>._M_head_impl[local_48]
                                  [local_68][lVar35].pl.head = ppVar11;
                                  pppVar26 = &(this->cp).p._M_t.
                                              super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                              .super__Head_base<0UL,_cellp_***,_false>._M_head_impl
                                              [local_48][local_68][lVar35].pl.start;
                                }
                                else {
                                  pppVar26 = &ppVar12->next;
                                }
                                *pppVar26 = ppVar11;
                                delete_particle(this,ppVar32,false);
                              }
                            }
                            lVar38 = lVar38 + 1;
                          } while (lVar38 < this->n_ion_populations);
                        }
                      }
                      else {
                        iVar23 = this->n_random;
                        pdVar33 = this->random;
                        iVar34 = iVar23 + 1;
                        dVar49 = pdVar33[iVar23 % 0x37] -
                                 pdVar33[iVar23 + 0x1f + ((iVar23 + 0x1f) / 0x37) * -0x37];
                        auVar56._8_8_ = 0;
                        auVar56._0_8_ = dVar49;
                        uVar21 = vcmpsd_avx512f(auVar56,ZEXT816(0),1);
                        bVar14 = (bool)((byte)uVar21 & 1);
                        local_58 = (double)((ulong)bVar14 * (long)(dVar49 + 1.0) +
                                           (ulong)!bVar14 * (long)dVar49);
                        pdVar33[iVar23 % 0x37] = local_58;
                        if (0x36 < iVar23) {
                          iVar34 = 0;
                        }
                        this->n_random = iVar34;
                        local_78 = *ppd;
                        dVar49 = (ppVar32->q * -2.0) / *pdVar25;
LAB_001357ef:
                        dVar49 = pow(dVar49,4.0);
                        if (local_58 < (1.0 / (dVar49 + 1.0)) * local_78) {
                          ppVar11 = ppVar32->next;
                          ppVar12 = ppVar32->previous;
                          if (ppVar11 != (particle *)0x0) {
                            ppVar11->previous = ppVar12;
                          }
                          if (ppVar12 == (particle *)0x0) {
                            (this->cp).p._M_t.
                            super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                            super__Head_base<0UL,_cellp_***,_false>._M_head_impl[local_48][local_68]
                            [lVar35].pl.head = ppVar11;
                            pppVar26 = &(this->cp).p._M_t.
                                        super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                        .super__Head_base<0UL,_cellp_***,_false>._M_head_impl
                                        [local_48][local_68][lVar35].pl.start;
                          }
                          else {
                            pppVar26 = &ppVar12->next;
                          }
                          *pppVar26 = ppVar11;
                          delete_particle(this,ppVar32,false);
                        }
                      }
                      ppVar32 = ppVar10;
                    } while (ppVar10 != (particle *)0x0);
                    iVar34 = this->nz;
                  }
                  lVar35 = lVar35 + 1;
                } while (lVar35 < iVar34);
                iVar23 = this->ny;
              }
              local_68 = local_68 + 1;
            } while (local_68 < iVar23);
            uVar27 = (ulong)(uint)this->nx;
          }
          local_48 = local_48 + 1;
        } while (local_48 < (int)uVar27);
        if (0 < (int)uVar27) {
          iVar23 = this->ny;
          local_48 = 0;
          do {
            if (0 < iVar23) {
              iVar34 = this->nz;
              local_68 = 0;
              do {
                if (0 < iVar34) {
                  lVar35 = 0;
                  do {
                    lVar38 = (long)(this->cp).p._M_t.
                                   super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                   .super__Head_base<0UL,_cellp_***,_false>._M_head_impl[local_48]
                                   [local_68][lVar35].pl.head;
                    if (lVar38 != 0) {
                      do {
                        dVar49 = *(double *)(lVar38 + 0x40);
                        if ((dVar49 != -1.0) || (NAN(dVar49))) {
                          if ((dVar49 != 1.0) || (NAN(dVar49))) {
                            if ((dVar49 != 0.0) || (NAN(dVar49))) {
                              iVar23 = this->n_ion_populations;
                              if (0 < iVar23) {
                                lVar39 = 0;
                                do {
                                  if ((*(double *)(lVar38 + 0x40) == this->icmr[lVar39]) &&
                                     (!NAN(*(double *)(lVar38 + 0x40)) && !NAN(this->icmr[lVar39])))
                                  {
                                    dVar49 = *(double *)(lVar38 + 0x38);
                                    dVar1 = ppd[lVar39 + 3];
                                    dVar50 = pow((dVar49 + dVar49) / pdVar25[lVar39 + 3],4.0);
                                    auVar54._0_8_ = 1.0 / (dVar50 + 1.0);
                                    auVar54._8_8_ = 0;
                                    auVar5._8_8_ = 0;
                                    auVar5._0_8_ = dVar1;
                                    auVar55 = vfnmadd132sd_fma(auVar54,ZEXT816(0x3ff0000000000000),
                                                               auVar5);
                                    dVar49 = dVar49 / auVar55._0_8_;
                                    *(double *)(lVar38 + 0x38) = dVar49;
                                    __s[lVar39 + 3] = dVar49 + __s[lVar39 + 3];
                                    iVar23 = this->n_ion_populations;
                                  }
                                  lVar39 = lVar39 + 1;
                                } while (lVar39 < iVar23);
                              }
                            }
                            else {
                              dVar49 = *(double *)(lVar38 + 0x38);
                              dVar1 = ppd[2];
                              dVar50 = pow((dVar49 + dVar49) / pdVar25[2],4.0);
                              auVar53._0_8_ = 1.0 / (dVar50 + 1.0);
                              auVar53._8_8_ = 0;
                              auVar4._8_8_ = 0;
                              auVar4._0_8_ = dVar1;
                              auVar55 = vfnmadd132sd_fma(auVar53,ZEXT816(0x3ff0000000000000),auVar4)
                              ;
                              dVar49 = dVar49 / auVar55._0_8_;
                              *(double *)(lVar38 + 0x38) = dVar49;
                              __s[2] = dVar49 + __s[2];
                            }
                          }
                          else {
                            dVar49 = *(double *)(lVar38 + 0x38);
                            dVar1 = ppd[1];
                            dVar50 = pow((dVar49 + dVar49) / pdVar25[1],4.0);
                            auVar52._0_8_ = 1.0 / (dVar50 + 1.0);
                            auVar52._8_8_ = 0;
                            auVar3._8_8_ = 0;
                            auVar3._0_8_ = dVar1;
                            auVar55 = vfnmadd132sd_fma(auVar52,ZEXT816(0x3ff0000000000000),auVar3);
                            dVar49 = dVar49 / auVar55._0_8_;
                            *(double *)(lVar38 + 0x38) = dVar49;
                            __s[1] = dVar49 + __s[1];
                          }
                        }
                        else {
                          dVar49 = *(double *)(lVar38 + 0x38);
                          dVar1 = *ppd;
                          dVar50 = pow((dVar49 * -2.0) / *pdVar25,4.0);
                          auVar51._0_8_ = 1.0 / (dVar50 + 1.0);
                          auVar51._8_8_ = 0;
                          auVar2._8_8_ = 0;
                          auVar2._0_8_ = dVar1;
                          auVar55 = vfnmadd132sd_fma(auVar51,ZEXT816(0x3ff0000000000000),auVar2);
                          dVar49 = dVar49 / auVar55._0_8_;
                          *(double *)(lVar38 + 0x38) = dVar49;
                          *__s = *__s - dVar49;
                        }
                        lVar38 = *(long *)(lVar38 + 0x58);
                      } while (lVar38 != 0);
                      iVar34 = this->nz;
                    }
                    lVar35 = lVar35 + 1;
                  } while (lVar35 < iVar34);
                  iVar23 = this->ny;
                }
                local_68 = local_68 + 1;
              } while (local_68 < iVar23);
              uVar27 = (ulong)(uint)this->nx;
            }
            local_48 = local_48 + 1;
          } while (local_48 < (int)uVar27);
        }
      }
      uVar24 = this->n_ion_populations;
      if (-3 < (int)uVar24) {
        auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar36 = 0;
        auVar41 = vpbroadcastq_avx512f();
        do {
          auVar42 = vpbroadcastq_avx512f();
          auVar42 = vporq_avx512f(auVar42,auVar40);
          uVar29 = vpcmpuq_avx512f(auVar42,auVar41,2);
          pdVar33 = __s + uVar36;
          bVar13 = (byte)uVar29;
          auVar47._8_8_ = (ulong)((byte)(uVar29 >> 1) & 1) * (long)pdVar33[1];
          auVar47._0_8_ = (ulong)(bVar13 & 1) * (long)*pdVar33;
          auVar47._16_8_ = (ulong)((byte)(uVar29 >> 2) & 1) * (long)pdVar33[2];
          auVar47._24_8_ = (ulong)((byte)(uVar29 >> 3) & 1) * (long)pdVar33[3];
          auVar47._32_8_ = (ulong)((byte)(uVar29 >> 4) & 1) * (long)pdVar33[4];
          auVar47._40_8_ = (ulong)((byte)(uVar29 >> 5) & 1) * (long)pdVar33[5];
          auVar47._48_8_ = (ulong)((byte)(uVar29 >> 6) & 1) * (long)pdVar33[6];
          auVar47._56_8_ = (uVar29 >> 7) * (long)pdVar33[7];
          uVar28 = vcmppd_avx512f(auVar47,ZEXT864(0) << 0x40,4);
          uVar28 = uVar29 & uVar28;
          uVar21 = vcmppd_avx512f(auVar47,ZEXT864(0) << 0x40,0);
          pdVar33 = __s_00 + uVar36;
          auVar48._8_8_ = (ulong)((byte)(uVar28 >> 1) & 1) * (long)pdVar33[1];
          auVar48._0_8_ = (ulong)((byte)uVar28 & 1) * (long)*pdVar33;
          auVar48._16_8_ = (ulong)((byte)(uVar28 >> 2) & 1) * (long)pdVar33[2];
          auVar48._24_8_ = (ulong)((byte)(uVar28 >> 3) & 1) * (long)pdVar33[3];
          auVar48._32_8_ = (ulong)((byte)(uVar28 >> 4) & 1) * (long)pdVar33[4];
          auVar48._40_8_ = (ulong)((byte)(uVar28 >> 5) & 1) * (long)pdVar33[5];
          auVar48._48_8_ = (ulong)((byte)(uVar28 >> 6) & 1) * (long)pdVar33[6];
          auVar48._56_8_ = (uVar28 >> 7) * (long)pdVar33[7];
          bVar22 = ~(bVar13 & (byte)uVar21);
          auVar42 = vdivpd_avx512f(auVar48,auVar47);
          pdVar33 = __s_00 + uVar36;
          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar29 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar29 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar29 >> 6) & 1);
          *pdVar33 = (double)((ulong)(bVar13 & 1) * (ulong)(bVar22 & 1) * auVar42._0_8_ |
                             (ulong)!(bool)(bVar13 & 1) * (long)*pdVar33);
          pdVar33[1] = (double)((ulong)bVar14 * (ulong)(bVar22 >> 1 & 1) * auVar42._8_8_ |
                               (ulong)!bVar14 * (long)pdVar33[1]);
          pdVar33[2] = (double)((ulong)bVar15 * (ulong)(bVar22 >> 2 & 1) * auVar42._16_8_ |
                               (ulong)!bVar15 * (long)pdVar33[2]);
          pdVar33[3] = (double)((ulong)bVar16 * (ulong)(bVar22 >> 3 & 1) * auVar42._24_8_ |
                               (ulong)!bVar16 * (long)pdVar33[3]);
          pdVar33[4] = (double)((ulong)bVar17 * (ulong)(bVar22 >> 4 & 1) * auVar42._32_8_ |
                               (ulong)!bVar17 * (long)pdVar33[4]);
          pdVar33[5] = (double)((ulong)bVar18 * (ulong)(bVar22 >> 5 & 1) * auVar42._40_8_ |
                               (ulong)!bVar18 * (long)pdVar33[5]);
          pdVar33[6] = (double)((ulong)bVar19 * (ulong)(bVar22 >> 6 & 1) * auVar42._48_8_ |
                               (ulong)!bVar19 * (long)pdVar33[6]);
          pdVar33[7] = (double)((uVar29 >> 7) * (ulong)(bVar22 >> 7) * auVar42._56_8_ |
                               (ulong)!SUB81(uVar29 >> 7,0) * (long)pdVar33[7]);
          uVar36 = uVar36 + 8;
        } while ((~((int)(uVar24 + 2) >> 0x1f) & uVar24 + 2 & 0x7ffffff8) + 8 != uVar36);
      }
      if (0 < (int)uVar27) {
        uVar37 = this->ny;
        uVar6 = this->nz;
        uVar36 = 0;
        do {
          if (0 < (int)uVar37) {
            pppcVar8 = (this->cp).p._M_t.
                       super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                       super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                       super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
            uVar28 = 0;
            do {
              if (0 < (int)uVar6) {
                uVar29 = 0;
                pcVar9 = pppcVar8[uVar36][uVar28];
                do {
                  lVar35 = (long)pcVar9[uVar29].pl.head;
                  if (lVar35 != 0) {
                    pdVar33 = this->icmr;
                    do {
                      dVar49 = *(double *)(lVar35 + 0x40);
                      if ((((dVar49 == -1.0) && (pdVar30 = __s_00, !NAN(dVar49))) ||
                          ((dVar49 == 1.0 && (pdVar30 = __s_00 + 1, !NAN(dVar49))))) ||
                         ((dVar49 == 0.0 && (pdVar30 = __s_00 + 2, !NAN(dVar49))))) {
                        *(double *)(lVar35 + 0x38) = *pdVar30 * *(double *)(lVar35 + 0x38);
                      }
                      else if (0 < (int)uVar24) {
                        uVar31 = 0;
                        do {
                          if ((dVar49 == pdVar33[uVar31]) && (!NAN(dVar49) && !NAN(pdVar33[uVar31]))
                             ) {
                            *(double *)(lVar35 + 0x38) =
                                 __s_00[uVar31 + 3] * *(double *)(lVar35 + 0x38);
                          }
                          uVar31 = uVar31 + 1;
                        } while (uVar24 != uVar31);
                      }
                      lVar35 = *(long *)(lVar35 + 0x58);
                    } while (lVar35 != 0);
                  }
                  uVar29 = uVar29 + 1;
                } while (uVar29 != uVar6);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != uVar37);
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != (uVar27 & 0xffffffff));
      }
      operator_delete__(pdVar25);
    }
  }
  operator_delete__(__s);
  operator_delete__(__s_00);
  return;
}

Assistant:

void spatial_region::pmerging(double* ppd, string pmerging)
{
    /* Из-за флуктуаций отношение удаляемого заряда к полному не равно
     * ppd, поэтому для сохранения нейтральности приходится считать
     * это отношение для каждого сорта частиц отдельно и использовать
     * именно его при при увеличении заряда */
    particle* current;
    particle* tmp;
    double* qs = new double[3+n_ion_populations];
    double* a = new double[3+n_ion_populations];
    for (int i=0;i<3+n_ion_populations;i++) {
        qs[i] = 0;
        a[i] = 0;
    }
    for(int i=0;i<nx;i++) {
        for(int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++) {
                current = cp[i][j][k].pl.head;
                while(current!=0) {
                    if (current->cmr==-1)
                        a[0] -= current->q;
                    else if (current->cmr==1)
                        a[1] += current->q;
                    else if (current->cmr==0)
                        a[2] += current->q;
                    else {
                        for (int ii=0;ii<n_ion_populations;ii++) {
                            if (current->cmr==icmr[ii])
                                a[3+ii] += current->q;
                        }
                    }
                    current = current->next;
                }
            }
        }
    }
    if (pmerging=="ti") {
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (get_rand()<ppd[0]) {
                            tmp = current->next;
                            if (current->cmr==-1)
                                qs[0] -= current->q;
                            else if (current->cmr==1)
                                qs[1] += current->q;
                            else if (current->cmr==0)
                                qs[2] += current->q;
                            else {
                                for (int ii=0;ii<n_ion_populations;ii++) {
                                    if (current->cmr==icmr[ii])
                                        qs[3+ii] += current->q;
                                }
                            }
                            //
                            if (current->next!=0)
                                (current->next)->previous = current->previous;
                            //
                            if (current->previous!=0)
                                (current->previous)->next = current->next;
                            else {
                                cp[i][j][k].pl.head = current->next;
                                cp[i][j][k].pl.start = cp[i][j][k].pl.head;
                            }
                            delete_particle(current);
                            //
                            current = tmp;
                        }
                        else
                            current = current->next;
                    }
                }
            }
        }
        //
        if (a[0]-qs[0]!=0)
            a[0] = a[0]/(a[0]-qs[0]);
        if (a[1]-qs[1]!=0)
            a[1] = a[1]/(a[1]-qs[1]);
        if (a[2]-qs[2]!=0)
            a[2] = a[2]/(a[2]-qs[2]);
        for (int i=0;i<n_ion_populations;i++) {
            if (a[3+i]-qs[3+i]!=0)
                a[3+i] = a[3+i]/(a[3+i]-qs[3+i]);
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            current->q = a[0]*current->q;
                        else if (current->cmr==1)
                            current->q = a[1]*current->q;
                        else if (current->cmr==0)
                            current->q = a[2]*current->q;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    current->q = a[3+ii]*current->q;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
    } else if (pmerging=="nl") {
        double* av_q = new double[3+n_ion_populations];
        for(int i=0;i<3+n_ion_populations;i++)
            av_q[i] = 0;
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            av_q[0] += 1;
                        else if (current->cmr==1)
                            av_q[1] += 1;
                        else if (current->cmr==0)
                            av_q[2] += 1;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    av_q[3+ii] += 1;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        for (int i=0;i<3+n_ion_populations;i++)
            av_q[i] = a[i]/av_q[i];
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        tmp = current->next;
                        if (current->cmr==-1) {
                            if (get_rand()<ppd[0]*_ppd(-current->q,av_q[0])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else if (current->cmr==1) {
                            if (get_rand()<ppd[1]*_ppd(current->q,av_q[1])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else if (current->cmr==0) {
                            if (get_rand()<ppd[2]*_ppd(current->q,av_q[2])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii]) {
                                    if (get_rand()<ppd[3+ii]*_ppd(current->q,av_q[3+ii])) {
                                        if (current->next!=0)
                                            (current->next)->previous = current->previous;
                                        if (current->previous!=0)
                                            (current->previous)->next = current->next;
                                        else {
                                            cp[i][j][k].pl.head = current->next;
                                            cp[i][j][k].pl.start = current->next;
                                        }
                                        delete_particle(current);
                                    } 
                                }
                            }
                        }
                        current = tmp;
                    }
                }
            }
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1) {
                            current->q = current->q/(1-ppd[0]*_ppd(-current->q,av_q[0]));
                            qs[0] -= current->q;
                        } else if (current->cmr==1) {
                            current->q = current->q/(1-ppd[1]*_ppd(current->q,av_q[1]));
                            qs[1] += current->q;
                        } else if (current->cmr==0) {
                            current->q = current->q/(1-ppd[2]*_ppd(current->q,av_q[2]));
                            qs[2] += current->q;
                        } else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii]) {
                                    current->q = current->q/(1-ppd[3+ii]*_ppd(current->q,av_q[3+ii]));
                                    qs[3+ii] += current->q;
                                }
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        for(int i=0;i<3+n_ion_populations;i++) {
            if (qs[i]!=0)
                a[i] = a[i]/qs[i];
            else
                a[i] = 0;
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            current->q = a[0]*current->q;
                        else if (current->cmr==1)
                            current->q = a[1]*current->q;
                        else if (current->cmr==0)
                            current->q = a[2]*current->q;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    current->q = a[3+ii]*current->q;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        delete[] av_q;
    }
    delete[] qs;
    delete[] a;
}